

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O2

Vec_Int_t * Vec_IntFlopBit(Vec_Int_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  
  iVar5 = 0;
LAB_0063fc64:
  do {
    if (p->nSize <= iVar5) {
      return p;
    }
    iVar1 = iVar5 + 1;
    piVar4 = p->pArray;
    if (iVar1 < p->nSize) {
      iVar2 = Abc_Lit2Var(piVar4[iVar5]);
      iVar3 = Abc_Lit2Var(p->pArray[iVar1]);
      if (iVar2 == iVar3) {
        iVar5 = iVar5 + 2;
        goto LAB_0063fc64;
      }
      piVar4 = p->pArray;
    }
    *(byte *)(piVar4 + iVar5) = *(byte *)(piVar4 + iVar5) ^ 1;
    iVar5 = iVar1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Flips the first bit in all entries of the vector.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline Vec_Int_t * Vec_IntFlopBit( Vec_Int_t * p )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
    {
        if ( i+1 < p->nSize && Abc_Lit2Var(p->pArray[i]) == Abc_Lit2Var(p->pArray[i+1]) ) 
            i++; // skip variable appearing as both pos and neg literal
        else
            p->pArray[i] ^= 1;
    }
    return p;
}